

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

ConvexH * ConvexDecomposition::ConvexHDup(ConvexH *src)

{
  ConvexH *this;
  
  this = (ConvexH *)::operator_new(0x30);
  ConvexH::ConvexH(this,(src->vertices).count,(src->edges).count,(src->facets).count);
  memcpy((this->vertices).element,(src->vertices).element,(long)(src->vertices).count * 0xc);
  memcpy((this->edges).element,(src->edges).element,(long)(src->edges).count << 2);
  memcpy((this->facets).element,(src->facets).element,(long)(src->facets).count << 4);
  return this;
}

Assistant:

ConvexH *ConvexHDup(ConvexH *src) {
	ConvexH *dst = new ConvexH(src->vertices.count,src->edges.count,src->facets.count);
	memcpy(dst->vertices.element,src->vertices.element,sizeof(float3)*src->vertices.count);
	memcpy(dst->edges.element,src->edges.element,sizeof(HalfEdge)*src->edges.count);
	memcpy(dst->facets.element,src->facets.element,sizeof(Plane)*src->facets.count);
	return dst;
}